

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_profile_check_key
              (mbedtls_x509_crt_profile *profile,mbedtls_pk_type_t pk_alg,mbedtls_pk_context *pk)

{
  int iVar1;
  size_t sVar2;
  
  if ((pk_alg == MBEDTLS_PK_RSASSA_PSS) || (pk_alg == MBEDTLS_PK_RSA)) {
    sVar2 = mbedtls_pk_get_bitlen(pk);
    iVar1 = -(uint)(sVar2 < profile->rsa_min_bitlen);
  }
  else if (pk_alg - MBEDTLS_PK_ECKEY < 3) {
    iVar1 = ((profile->allowed_curves >> ((byte)(*pk->pk_ctx - 1) & 0x1f) & 1) != 0) - 1;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int x509_profile_check_key( const mbedtls_x509_crt_profile *profile,
                                   mbedtls_pk_type_t pk_alg,
                                   const mbedtls_pk_context *pk )
{
#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA || pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        if( mbedtls_pk_get_bitlen( pk ) >= profile->rsa_min_bitlen )
            return( 0 );

        return( -1 );
    }
#endif

#if defined(MBEDTLS_ECP_C)
    if( pk_alg == MBEDTLS_PK_ECDSA ||
        pk_alg == MBEDTLS_PK_ECKEY ||
        pk_alg == MBEDTLS_PK_ECKEY_DH )
    {
        mbedtls_ecp_group_id gid = mbedtls_pk_ec( *pk )->grp.id;

        if( ( profile->allowed_curves & MBEDTLS_X509_ID_FLAG( gid ) ) != 0 )
            return( 0 );

        return( -1 );
    }
#endif

    return( -1 );
}